

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void drop_item_tail(tgestate_t *state,item_t item)

{
  room_t rVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = CONCAT71(in_register_00000031,item) & 0xffffffff;
  rVar1 = state->room_index;
  state->item_structs[uVar2].room_and_flags = rVar1;
  if (rVar1 != '\0') {
    state->item_structs[uVar2].mappos.u = (uint8_t)state->vischars[0].mi.mappos.u;
    state->item_structs[uVar2].mappos.v = (uint8_t)state->vischars[0].mi.mappos.v;
    state->item_structs[uVar2].mappos.w = '\x05';
    calc_interior_item_isopos(state->item_structs + uVar2);
    return;
  }
  scale_mappos_down(&state->vischars[0].mi.mappos,&state->item_structs[uVar2].mappos);
  state->item_structs[uVar2].mappos.w = '\0';
  calc_exterior_item_isopos(state->item_structs + uVar2);
  return;
}

Assistant:

void drop_item_tail(tgestate_t *state, item_t item)
{
  itemstruct_t *itemstr; /* was HL */
  room_t        room;    /* was A */
  mappos8_t    *outpos;  /* was DE */
  mappos16_t   *inpos;   /* was HL */

  assert(state != NULL);
  ASSERT_ITEM_VALID(item);

  itemstr = &state->item_structs[item];
  room = state->room_index;
  itemstr->room_and_flags = room; /* Set object's room index. */
  if (room == room_0_OUTDOORS)
  {
    /* Outdoors. */

    // TODO: Hoist common code.
    outpos = &itemstr->mappos;
    inpos  = &state->vischars[0].mi.mappos;

    scale_mappos_down(inpos, outpos);
    outpos->w = 0;

    calc_exterior_item_isopos(itemstr);
  }
  else
  {
    /* $7BE4: Drop item, interior part. */

    outpos = &itemstr->mappos;
    inpos  = &state->vischars[0].mi.mappos;

    outpos->u = inpos->u; // note: narrowing
    outpos->v = inpos->v; // note: narrowing
    outpos->w = 5;

    calc_interior_item_isopos(itemstr);
  }
}